

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

U32 HUF_setMaxHeight(nodeElt *huffNode,U32 lastNonNull,U32 maxNbBits)

{
  byte bVar1;
  BYTE BVar2;
  uint uVar3;
  bool bVar4;
  U32 lowTotal;
  U32 highTotal;
  U32 lowPos;
  U32 highPos;
  U32 nBitsToDecrease;
  U32 currentNbBits;
  int pos;
  U32 rankLast [14];
  uint local_30;
  U32 noSymbol;
  U32 n;
  U32 baseCost;
  int totalCost;
  U32 largestBits;
  U32 maxNbBits_local;
  U32 lastNonNull_local;
  nodeElt *huffNode_local;
  
  bVar1 = huffNode[lastNonNull].nbBits;
  huffNode_local._4_4_ = (U32)bVar1;
  if (maxNbBits < huffNode_local._4_4_) {
    n = 0;
    BVar2 = (BYTE)maxNbBits;
    local_30 = lastNonNull;
    while (maxNbBits < huffNode[local_30].nbBits) {
      n = ((1 << (bVar1 - BVar2 & 0x1f)) - (1 << (bVar1 - huffNode[local_30].nbBits & 0x1f))) + n;
      huffNode[local_30].nbBits = BVar2;
      local_30 = local_30 - 1;
    }
    while (huffNode[local_30].nbBits == maxNbBits) {
      local_30 = local_30 - 1;
    }
    n = (int)n >> (bVar1 - BVar2 & 0x1f);
    memset(&currentNbBits,0xf0,0x38);
    highPos = maxNbBits;
    for (nBitsToDecrease = local_30; -1 < (int)nBitsToDecrease;
        nBitsToDecrease = nBitsToDecrease - 1) {
      if (huffNode[(int)nBitsToDecrease].nbBits < highPos) {
        highPos = (U32)huffNode[(int)nBitsToDecrease].nbBits;
        (&currentNbBits)[maxNbBits - highPos] = nBitsToDecrease;
      }
    }
    while (0 < (int)n) {
      uVar3 = BIT_highbit32(n);
      for (lowPos = uVar3 + 1; 1 < lowPos; lowPos = lowPos - 1) {
        if (((&currentNbBits)[lowPos] != 0xf0f0f0f0) &&
           (((&currentNbBits)[lowPos - 1] == 0xf0f0f0f0 ||
            (huffNode[(&currentNbBits)[lowPos]].count <=
             huffNode[(&currentNbBits)[lowPos - 1]].count << 1)))) break;
      }
      while( true ) {
        bVar4 = false;
        if (lowPos < 0xd) {
          bVar4 = (&currentNbBits)[lowPos] == 0xf0f0f0f0;
        }
        if (!bVar4) break;
        lowPos = lowPos + 1;
      }
      n = n - (1 << ((char)lowPos - 1U & 0x1f));
      if ((&currentNbBits)[lowPos - 1] == 0xf0f0f0f0) {
        (&currentNbBits)[lowPos - 1] = (&currentNbBits)[lowPos];
      }
      huffNode[(&currentNbBits)[lowPos]].nbBits = huffNode[(&currentNbBits)[lowPos]].nbBits + '\x01'
      ;
      if ((&currentNbBits)[lowPos] == 0) {
        (&currentNbBits)[lowPos] = 0xf0f0f0f0;
      }
      else {
        (&currentNbBits)[lowPos] = (&currentNbBits)[lowPos] - 1;
        if ((uint)huffNode[(&currentNbBits)[lowPos]].nbBits != maxNbBits - lowPos) {
          (&currentNbBits)[lowPos] = 0xf0f0f0f0;
        }
      }
    }
    while (huffNode_local._4_4_ = maxNbBits, (int)n < 0) {
      if (pos == -0xf0f0f10) {
        while (huffNode[local_30].nbBits == maxNbBits) {
          local_30 = local_30 - 1;
        }
        huffNode[local_30 + 1].nbBits = huffNode[local_30 + 1].nbBits + 0xff;
        pos = local_30 + 1;
        n = n + 1;
      }
      else {
        huffNode[pos + 1U].nbBits = huffNode[pos + 1U].nbBits + 0xff;
        pos = pos + 1;
        n = n + 1;
      }
    }
  }
  return huffNode_local._4_4_;
}

Assistant:

static U32 HUF_setMaxHeight(nodeElt* huffNode, U32 lastNonNull, U32 maxNbBits)
{
    const U32 largestBits = huffNode[lastNonNull].nbBits;
    if (largestBits <= maxNbBits) return largestBits;   /* early exit : no elt > maxNbBits */

    /* there are several too large elements (at least >= 2) */
    {   int totalCost = 0;
        const U32 baseCost = 1 << (largestBits - maxNbBits);
        U32 n = lastNonNull;

        while (huffNode[n].nbBits > maxNbBits) {
            totalCost += baseCost - (1 << (largestBits - huffNode[n].nbBits));
            huffNode[n].nbBits = (BYTE)maxNbBits;
            n --;
        }  /* n stops at huffNode[n].nbBits <= maxNbBits */
        while (huffNode[n].nbBits == maxNbBits) n--;   /* n end at index of smallest symbol using < maxNbBits */

        /* renorm totalCost */
        totalCost >>= (largestBits - maxNbBits);  /* note : totalCost is necessarily a multiple of baseCost */

        /* repay normalized cost */
        {   U32 const noSymbol = 0xF0F0F0F0;
            U32 rankLast[HUF_TABLELOG_MAX+2];
            int pos;

            /* Get pos of last (smallest) symbol per rank */
            memset(rankLast, 0xF0, sizeof(rankLast));
            {   U32 currentNbBits = maxNbBits;
                for (pos=n ; pos >= 0; pos--) {
                    if (huffNode[pos].nbBits >= currentNbBits) continue;
                    currentNbBits = huffNode[pos].nbBits;   /* < maxNbBits */
                    rankLast[maxNbBits-currentNbBits] = pos;
            }   }

            while (totalCost > 0) {
                U32 nBitsToDecrease = BIT_highbit32(totalCost) + 1;
                for ( ; nBitsToDecrease > 1; nBitsToDecrease--) {
                    U32 highPos = rankLast[nBitsToDecrease];
                    U32 lowPos = rankLast[nBitsToDecrease-1];
                    if (highPos == noSymbol) continue;
                    if (lowPos == noSymbol) break;
                    {   U32 const highTotal = huffNode[highPos].count;
                        U32 const lowTotal = 2 * huffNode[lowPos].count;
                        if (highTotal <= lowTotal) break;
                }   }
                /* only triggered when no more rank 1 symbol left => find closest one (note : there is necessarily at least one !) */
                /* HUF_MAX_TABLELOG test just to please gcc 5+; but it should not be necessary */
                while ((nBitsToDecrease<=HUF_TABLELOG_MAX) && (rankLast[nBitsToDecrease] == noSymbol))
                    nBitsToDecrease ++;
                totalCost -= 1 << (nBitsToDecrease-1);
                if (rankLast[nBitsToDecrease-1] == noSymbol)
                    rankLast[nBitsToDecrease-1] = rankLast[nBitsToDecrease];   /* this rank is no longer empty */
                huffNode[rankLast[nBitsToDecrease]].nbBits ++;
                if (rankLast[nBitsToDecrease] == 0)    /* special case, reached largest symbol */
                    rankLast[nBitsToDecrease] = noSymbol;
                else {
                    rankLast[nBitsToDecrease]--;
                    if (huffNode[rankLast[nBitsToDecrease]].nbBits != maxNbBits-nBitsToDecrease)
                        rankLast[nBitsToDecrease] = noSymbol;   /* this rank is now empty */
            }   }   /* while (totalCost > 0) */

            while (totalCost < 0) {  /* Sometimes, cost correction overshoot */
                if (rankLast[1] == noSymbol) {  /* special case : no rank 1 symbol (using maxNbBits-1); let's create one from largest rank 0 (using maxNbBits) */
                    while (huffNode[n].nbBits == maxNbBits) n--;
                    huffNode[n+1].nbBits--;
                    rankLast[1] = n+1;
                    totalCost++;
                    continue;
                }
                huffNode[ rankLast[1] + 1 ].nbBits--;
                rankLast[1]++;
                totalCost ++;
    }   }   }   /* there are several too large elements (at least >= 2) */

    return maxNbBits;
}